

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

statement_base * __thiscall
cs::method_package::translate
          (method_package *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  const_reference pptVar1;
  compile_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      package_name)._M_string_length == 0) {
    pptVar1 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                        ((raw->
                         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                         )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
    local_40._M_dataplus._M_p = (pointer)(*pptVar1)[1]._vptr_token_base;
    tree_type<cs::token_base_*>::iterator::data((iterator *)&local_40);
    std::__cxx11::string::_M_assign
              ((string *)
               &((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->package_name);
    return (statement_base *)0x0;
  }
  this_00 = (compile_error *)__cxa_allocate_exception(0x28);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Redefinition of package: ","");
  std::operator+(&local_40,&local_60,
                 &((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->package_name);
  compile_error::compile_error(this_00,&local_40);
  __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

statement_base *
	method_package::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		if (!context->package_name.empty())
			throw compile_error(std::string("Redefinition of package: ") + context->package_name);
		context->package_name = static_cast<token_id *>(static_cast<token_expr *>(raw.front().at(
		                            1))->get_tree().root().data())->get_id();
		return nullptr;
	}